

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::AboveMaximum(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,int64_t actual,SValue *expected,bool exclusive)

{
  bool bVar1;
  undefined7 in_register_00000009;
  ushort uVar2;
  code *exclusive_00;
  Data local_18;
  
  local_18.s.str = (Ch *)0x96000000000000;
  if (actual < 0) {
    uVar2 = 0xb6;
    if (actual < -0x80000000) goto LAB_00143f57;
  }
  else {
    bVar1 = (ulong)actual >> 0x20 == 0;
    local_18.s.str = (Ch *)((ulong)bVar1 << 0x36 | 0x196000000000000);
    if (0x7fffffff < (ulong)actual) goto LAB_00143f57;
    uVar2 = (ushort)bVar1 << 6 | 0x1b6;
  }
  local_18.s.str = (Ch *)((ulong)uVar2 << 0x30);
LAB_00143f57:
  if (exclusive) {
    exclusive_00 = internal::
                   Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                   ::GetExclusiveMaximumString;
  }
  else {
    exclusive_00 = (_func_ValueType_ptr *)0x0;
  }
  local_18.n = (Number)actual;
  AddNumberError(this,(ValidateErrorCode)CONCAT71(in_register_00000009,exclusive) |
                      kValidateErrorMaximum,(ValueType *)&local_18.s,expected,exclusive_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return;
}

Assistant:

void AboveMaximum(int64_t actual, const SValue& expected, bool exclusive) {
        AddNumberError(exclusive ? kValidateErrorExclusiveMaximum : kValidateErrorMaximum, ValueType(actual).Move(), expected,
            exclusive ? &SchemaType::GetExclusiveMaximumString : 0);
    }